

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

QList<QListWidgetItem_*> * __thiscall
QListWidget::findItems(QListWidget *this,QString *text,MatchFlags flags)

{
  QListModel *pQVar1;
  QAbstractItemModel *pQVar2;
  qsizetype qVar3;
  const_reference this_00;
  undefined4 in_ECX;
  QString *in_RDX;
  QAbstractItemView *in_RSI;
  QList<QListWidgetItem_*> *in_RDI;
  long in_FS_OFFSET;
  int i;
  int indexesSize;
  QListWidgetPrivate *d;
  QList<QListWidgetItem_*> *items;
  QModelIndexList indexes;
  int in_stack_ffffffffffffff1c;
  QList<QListWidgetItem_*> *this_01;
  int local_ac;
  qsizetype in_stack_ffffffffffffff88;
  undefined1 local_60 [24];
  QList<QModelIndex> local_48;
  undefined4 local_2c;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  local_2c = in_ECX;
  d_func((QListWidget *)0x89ea3e);
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = QListWidgetPrivate::listModel((QListWidgetPrivate *)0x89ea7a);
  pQVar2 = QAbstractItemView::model(in_RSI);
  QModelIndex::QModelIndex((QModelIndex *)0x89ea98);
  (**(code **)(*(long *)pQVar2 + 0x60))(local_60,pQVar2,0,0,&stack0xffffffffffffff88);
  ::QVariant::QVariant(&local_28,in_RDX);
  (**(code **)(*(long *)pQVar1 + 0x150))(&local_48,pQVar1,local_60,0,&local_28,0xffffffff);
  ::QVariant::~QVariant(&local_28);
  (this_01->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (this_01->d).ptr = (QListWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
  (this_01->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QListWidgetItem_*>::QList((QList<QListWidgetItem_*> *)0x89eb44);
  qVar3 = QList<QModelIndex>::size(&local_48);
  QList<QListWidgetItem_*>::reserve(this_01,in_stack_ffffffffffffff88);
  for (local_ac = 0; local_ac < (int)qVar3; local_ac = local_ac + 1) {
    pQVar1 = QListWidgetPrivate::listModel((QListWidgetPrivate *)0x89eb80);
    this_00 = QList<QModelIndex>::at
                        ((QList<QModelIndex> *)pQVar1,CONCAT44(in_stack_ffffffffffffff1c,local_2c));
    QModelIndex::row(this_00);
    QListModel::at(pQVar1,in_stack_ffffffffffffff1c);
    QList<QListWidgetItem_*>::append
              ((QList<QListWidgetItem_*> *)0x89ebb8,
               (parameter_type)CONCAT44(in_stack_ffffffffffffff1c,local_2c));
  }
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x89ebe8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QList<QListWidgetItem*> QListWidget::findItems(const QString &text, Qt::MatchFlags flags) const
{
    Q_D(const QListWidget);
    QModelIndexList indexes = d->listModel()->match(model()->index(0, 0, QModelIndex()),
                                                Qt::DisplayRole, text, -1, flags);
    QList<QListWidgetItem*> items;
    const int indexesSize = indexes.size();
    items.reserve(indexesSize);
    for (int i = 0; i < indexesSize; ++i)
        items.append(d->listModel()->at(indexes.at(i).row()));
    return items;
}